

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
          (cmInstallDirectoryGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,string *dest,string *file_permissions,string *dir_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,
          string literal_args,bool optional,cmListFileBacktrace backtrace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pbVar5;
  undefined8 uVar6;
  size_type sVar7;
  string *dir;
  pointer input;
  string local_90;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  cmListFileBacktrace local_48;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar4 = (dest->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + dest->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar4 = (component->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + component->_M_string_length);
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)literal_args.field_2._M_allocated_capacity;
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (literal_args.field_2._M_allocated_capacity + 8);
  *(undefined8 *)(literal_args.field_2._M_allocated_capacity + 8) = 0;
  *(undefined8 *)literal_args.field_2._M_allocated_capacity = 0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_70,configurations,&local_90,message,
             exclude_from_all,false,&local_48);
  if (local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallDirectoryGenerator_009533f8;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,dirs);
  paVar3 = &(this->FilePermissions).field_2;
  (this->FilePermissions)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (file_permissions->_M_dataplus)._M_p;
  paVar1 = &file_permissions->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar6 = *(undefined8 *)((long)&file_permissions->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->FilePermissions).field_2 + 8) = uVar6;
  }
  else {
    (this->FilePermissions)._M_dataplus._M_p = pcVar4;
    (this->FilePermissions).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->FilePermissions)._M_string_length = file_permissions->_M_string_length;
  (file_permissions->_M_dataplus)._M_p = (pointer)paVar1;
  file_permissions->_M_string_length = 0;
  (file_permissions->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->DirPermissions).field_2;
  (this->DirPermissions)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (dir_permissions->_M_dataplus)._M_p;
  paVar3 = &dir_permissions->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar3) {
    uVar6 = *(undefined8 *)((long)&dir_permissions->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar3->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->DirPermissions).field_2 + 8) = uVar6;
  }
  else {
    (this->DirPermissions)._M_dataplus._M_p = pcVar4;
    (this->DirPermissions).field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  (this->DirPermissions)._M_string_length = dir_permissions->_M_string_length;
  (dir_permissions->_M_dataplus)._M_p = (pointer)paVar3;
  dir_permissions->_M_string_length = 0;
  (dir_permissions->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->LiteralArguments).field_2;
  (this->LiteralArguments)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(literal_args._M_dataplus._M_p + 0x10);
  if (*(size_type **)literal_args._M_dataplus._M_p == psVar2) {
    uVar6 = *(undefined8 *)(literal_args._M_dataplus._M_p + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->LiteralArguments).field_2 + 8) = uVar6;
  }
  else {
    (this->LiteralArguments)._M_dataplus._M_p =
         (pointer)*(size_type **)literal_args._M_dataplus._M_p;
    (this->LiteralArguments).field_2._M_allocated_capacity = *psVar2;
  }
  (this->LiteralArguments)._M_string_length = *(size_type *)(literal_args._M_dataplus._M_p + 8);
  *(size_type **)literal_args._M_dataplus._M_p = psVar2;
  literal_args._M_dataplus._M_p[8] = '\0';
  literal_args._M_dataplus._M_p[9] = '\0';
  literal_args._M_dataplus._M_p[10] = '\0';
  literal_args._M_dataplus._M_p[0xb] = '\0';
  literal_args._M_dataplus._M_p[0xc] = '\0';
  literal_args._M_dataplus._M_p[0xd] = '\0';
  literal_args._M_dataplus._M_p[0xe] = '\0';
  literal_args._M_dataplus._M_p[0xf] = '\0';
  literal_args._M_dataplus._M_p[0x10] = '\0';
  this->Optional = literal_args._M_string_length._0_1_;
  local_50 = &this->Directories;
  sVar7 = cmGeneratorExpression::Find(&(this->super_cmInstallGenerator).Destination);
  if (sVar7 == 0xffffffffffffffff) {
    if (((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) == 0) {
      pbVar5 = (dirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (input = (dirs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; input != pbVar5; input = input + 1) {
        sVar7 = cmGeneratorExpression::Find(input);
        if (sVar7 != 0xffffffffffffffff) goto LAB_004ef0cf;
      }
    }
  }
  else {
LAB_004ef0cf:
    (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  }
  return;
}

Assistant:

cmInstallDirectoryGenerator::cmInstallDirectoryGenerator(
  std::vector<std::string> const& dirs, std::string const& dest,
  std::string file_permissions, std::string dir_permissions,
  std::vector<std::string> const& configurations, std::string const& component,
  MessageLevel message, bool exclude_from_all, std::string literal_args,
  bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , Directories(dirs)
  , FilePermissions(std::move(file_permissions))
  , DirPermissions(std::move(dir_permissions))
  , LiteralArguments(std::move(literal_args))
  , Optional(optional)
{
  // We need per-config actions if destination have generator expressions.
  if (cmGeneratorExpression::Find(this->Destination) != std::string::npos) {
    this->ActionsPerConfig = true;
  }

  // We need per-config actions if any directories have generator expressions.
  if (!this->ActionsPerConfig) {
    for (std::string const& dir : dirs) {
      if (cmGeneratorExpression::Find(dir) != std::string::npos) {
        this->ActionsPerConfig = true;
        break;
      }
    }
  }
}